

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__writefv(stbi__write_context *s,char *fmt,__va_list_tag *v)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  undefined1 *puVar4;
  undefined4 *puVar5;
  undefined2 *puVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  byte *pbVar10;
  uchar x;
  uchar b_1 [2];
  uchar b [4];
  undefined8 uStack_38;
  
  uVar3 = CONCAT71((int7)((ulong)in_RAX >> 8),*fmt);
  if (*fmt != '\0') {
    pbVar10 = (byte *)(fmt + 1);
    uStack_38 = uVar3;
    do {
      uVar2 = (uint)uVar3 & 0xff;
      if (uVar2 < 0x32) {
        if (uVar2 != 0x20) {
          if (uVar2 != 0x31) {
            return;
          }
          uVar2 = v->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar4 = (undefined1 *)((ulong)uVar2 + (long)v->reg_save_area);
            v->gp_offset = uVar2 + 8;
          }
          else {
            puVar4 = (undefined1 *)v->overflow_arg_area;
            v->overflow_arg_area = puVar4 + 8;
          }
          uStack_38._0_2_ = CONCAT11(*puVar4,(undefined1)uStack_38);
          pvVar9 = s->context;
          iVar7 = 1;
          pvVar8 = (void *)((long)&uStack_38 + 1);
          goto LAB_001bebc5;
        }
      }
      else {
        if (uVar2 == 0x32) {
          uVar2 = v->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar6 = (undefined2 *)((ulong)uVar2 + (long)v->reg_save_area);
            v->gp_offset = uVar2 + 8;
          }
          else {
            puVar6 = (undefined2 *)v->overflow_arg_area;
            v->overflow_arg_area = puVar6 + 4;
          }
          uStack_38._0_4_ = CONCAT22(*puVar6,(undefined2)uStack_38);
          pvVar9 = s->context;
          iVar7 = 2;
          pvVar8 = (void *)((long)&uStack_38 + 2);
        }
        else {
          if (uVar2 != 0x34) {
            return;
          }
          uVar2 = v->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar5 = (undefined4 *)((ulong)uVar2 + (long)v->reg_save_area);
            v->gp_offset = uVar2 + 8;
          }
          else {
            puVar5 = (undefined4 *)v->overflow_arg_area;
            v->overflow_arg_area = puVar5 + 2;
          }
          uStack_38 = CONCAT44(*puVar5,(undefined4)uStack_38);
          pvVar9 = s->context;
          iVar7 = 4;
          pvVar8 = (void *)((long)&uStack_38 + 4);
        }
LAB_001bebc5:
        (*s->func)(pvVar9,pvVar8,iVar7);
      }
      bVar1 = *pbVar10;
      uVar3 = (ulong)bVar1;
      pbVar10 = pbVar10 + 1;
    } while (bVar1 != 0);
  }
  return;
}

Assistant:

static void stbiw__writefv(stbi__write_context *s, const char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { unsigned char x = STBIW_UCHAR(va_arg(v, int));
                     s->func(s->context,&x,1);
                     break; }
         case '2': { int x = va_arg(v,int);
                     unsigned char b[2];
                     b[0] = STBIW_UCHAR(x);
                     b[1] = STBIW_UCHAR(x>>8);
                     s->func(s->context,b,2);
                     break; }
         case '4': { stbiw_uint32 x = va_arg(v,int);
                     unsigned char b[4];
                     b[0]=STBIW_UCHAR(x);
                     b[1]=STBIW_UCHAR(x>>8);
                     b[2]=STBIW_UCHAR(x>>16);
                     b[3]=STBIW_UCHAR(x>>24);
                     s->func(s->context,b,4);
                     break; }
         default:
            STBIW_ASSERT(0);
            return;
      }
   }
}